

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::BasicUsageVS::Run(BasicUsageVS *this)

{
  bool bVar1;
  GLuint GVar2;
  undefined4 *puVar3;
  GLuint *pGVar4;
  GLuint *data;
  uint *ptr;
  uint array_buffer_data [32];
  char *xfb_var [2];
  char *src_fs;
  char *src_vs;
  allocator<char> local_41;
  string local_40;
  int local_20;
  int local_1c;
  GLint p2;
  GLint p1;
  BasicUsageVS *this_local;
  
  _p2 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92cc,&local_1c);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92d2,&local_20);
  if ((local_1c < 2) || (local_20 < 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS or GL_MAX_VERTEX_ATOMIC_COUNTERS are less than required"
               ,&local_41);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (BasicUsageVS *)0x10;
  }
  else {
    GVar2 = glcts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 310 es\nlayout(location = 0) in uint i_zero;\nflat out uint o_atomic_inc;\nflat out uint o_atomic_dec;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 1, offset = 0) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  o_atomic_inc = i_zero + atomicCounterIncrement(ac_counter_inc);\n  o_atomic_dec = i_zero + atomicCounterDecrement(ac_counter_dec);\n}"
                       ,
                       "#version 310 es                \nout mediump vec4 color;        \nvoid main() {                  \n    color = vec4(0, 1, 0, 1);  \n}"
                       ,false);
    this->prog_ = GVar2;
    array_buffer_data._120_8_ = anon_var_dwarf_15e7a8;
    glu::CallLogWrapper::glTransformFeedbackVaryings
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->prog_,2,(GLchar **)(array_buffer_data + 0x1e),0x8c8d);
    glcts::anon_unknown_0::SACSubcaseBase::LinkProgram(&this->super_SACSubcaseBase,this->prog_);
    memset(&ptr,0,0x80);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               1,&this->array_buffer_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8892,this->array_buffer_);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8892,0x80,&ptr,0x88e4);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8892,0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               2,this->counter_buffer_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->counter_buffer_[0]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,4,(void *)0x0,0x88ea);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->counter_buffer_[1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,4,(void *)0x0,0x88ea);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               2,this->xfb_buffer_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,this->xfb_buffer_[0]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->counter_buffer_[0]);
    puVar3 = (undefined4 *)
             glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x92c0,0,4,10);
    *puVar3 = 7;
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->counter_buffer_[1]);
    puVar3 = (undefined4 *)
             glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x92c0,0,4,10);
    *puVar3 = 0x4d;
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               1,&this->vao_);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->vao_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8892,this->array_buffer_);
    glu::CallLogWrapper::glVertexAttribIPointer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0,1,0x1405,0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8892,0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0);
    glu::CallLogWrapper::glEnable
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c89);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0,this->counter_buffer_[0]);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,1,this->counter_buffer_[1]);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,0,this->xfb_buffer_[0]);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,1,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->prog_);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->vao_);
    glu::CallLogWrapper::glBeginTransformFeedback
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0,0,0x20);
    glu::CallLogWrapper::glEndTransformFeedback
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper)
    ;
    glu::CallLogWrapper::glDisable
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c89);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,this->xfb_buffer_[0]);
    pGVar4 = (GLuint *)
             glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x8c8e,0,0x80,3);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      (&this->super_SACSubcaseBase,0x20,pGVar4,7);
    if (bVar1) {
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c8e);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c8e,0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c8e,this->xfb_buffer_[1]);
      pGVar4 = (GLuint *)
               glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x8c8e,0,0x80,3);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        (&this->super_SACSubcaseBase,0x20,pGVar4,0x2d);
      if (bVar1) {
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c8e);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c8e,0);
        bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_[0],0,0x27);
        if (bVar1) {
          bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_[1],0,0x2d);
          if (bVar1) {
            this_local = (BasicUsageVS *)0x0;
          }
          else {
            this_local = (BasicUsageVS *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicUsageVS *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicUsageVS *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicUsageVS *)&DAT_ffffffffffffffff;
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &p2);
		if (p1 < 2 || p2 < 2)
		{
			OutputNotSupported(
				"GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS or GL_MAX_VERTEX_ATOMIC_COUNTERS are less than required");
			return NOT_SUPPORTED;
		}

		// create program
		const char* src_vs =
			"#version 310 es" NL "layout(location = 0) in uint i_zero;" NL "flat out uint o_atomic_inc;" NL
			"flat out uint o_atomic_dec;" NL "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;" NL
			"layout(binding = 1, offset = 0) uniform atomic_uint ac_counter_dec;" NL "void main() {" NL
			"  o_atomic_inc = i_zero + atomicCounterIncrement(ac_counter_inc);" NL
			"  o_atomic_dec = i_zero + atomicCounterDecrement(ac_counter_dec);" NL "}";

		const char* src_fs = "#version 310 es                \n"
							 "out mediump vec4 color;        \n"
							 "void main() {                  \n"
							 "    color = vec4(0, 1, 0, 1);  \n"
							 "}";

		prog_				   = CreateProgram(src_vs, src_fs, false);
		const char* xfb_var[2] = { "o_atomic_inc", "o_atomic_dec" };
		glTransformFeedbackVaryings(prog_, 2, xfb_var, GL_SEPARATE_ATTRIBS);
		LinkProgram(prog_);

		// create array buffer
		const unsigned int array_buffer_data[32] = { 0 };
		glGenBuffers(1, &array_buffer_);
		glBindBuffer(GL_ARRAY_BUFFER, array_buffer_);
		glBufferData(GL_ARRAY_BUFFER, sizeof(array_buffer_data), array_buffer_data, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		// create atomic counter buffers
		glGenBuffers(2, counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_[0]);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_[1]);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffers
		glGenBuffers(2, xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// init counter buffers
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_[0]);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 4, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr = 7;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_[1]);
		ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 4, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr = 77;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		// create vertex array object
		glGenVertexArrays(1, &vao_);
		glBindVertexArray(vao_);
		glBindBuffer(GL_ARRAY_BUFFER, array_buffer_);
		glVertexAttribIPointer(0, 1, GL_UNSIGNED_INT, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		// draw
		glEnable(GL_RASTERIZER_DISCARD);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_[0]);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, counter_buffer_[1]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, xfb_buffer_[1]);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glBeginTransformFeedback(GL_POINTS);
		glDrawArrays(GL_POINTS, 0, 32);
		glEndTransformFeedback();
		glDisable(GL_RASTERIZER_DISCARD);

		// validate
		GLuint* data;
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		// CheckCounterValues will sort in place, so map buffer for both read and write
		data = static_cast<GLuint*>(
			glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 32 * 4, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));
		if (!CheckCounterValues(32, data, 7))
			return ERROR;
		glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		data = static_cast<GLuint*>(
			glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 32 * 4, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT));
		if (!CheckCounterValues(32, data, 45))
			return ERROR;
		glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		if (!CheckFinalCounterValue(counter_buffer_[0], 0, 39))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_[1], 0, 45))
			return ERROR;

		return NO_ERROR;
	}